

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O0

char * MOS65XX_group_name(csh handle,uint id)

{
  uint id_local;
  csh handle_local;
  char *local_8;
  
  if (id < 7) {
    local_8 = GroupNames[(int)id];
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *MOS65XX_group_name(csh handle, unsigned int id)
{
#ifdef CAPSTONE_DIET
	return NULL;
#else
	if (id >= ARR_SIZE(GroupNames)) {
		return NULL;
	}
	return GroupNames[(int)id];
#endif
}